

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

void __thiscall
gimage::RAWImageIO::loadHeader(RAWImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  IOException *this_00;
  bool msbfirst;
  long *plStack_b8;
  int type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 != '\0') {
    (anonymous_namespace)::readRAWHeader_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)name,(char *)&type,(int *)&msbfirst,(bool *)width,
               height,plStack_b8);
    std::__cxx11::string::~string((string *)&local_50);
    *depth = 1;
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_b0,name,(allocator *)((long)register0x00000020 + -0xb6));
  std::operator+(&local_90,"Can only load RAW image (",&local_b0);
  std::operator+(&local_70,&local_90,")");
  gutil::IOException::IOException(this_00,&local_70);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void RAWImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  int  type;
  bool msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  readRAWHeader(name, type, msbfirst, width, height);
  depth=1;
}